

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::queueError<Identifier,unsigned_long,unsigned_long>
               (ErrorType type,char *text,Identifier *args,unsigned_long *args_1,
               unsigned_long *args_2)

{
  ErrorType type_00;
  size_t extraout_RDX;
  unsigned_long *in_R9;
  string_view text_00;
  undefined1 local_50 [8];
  string message;
  unsigned_long *args_local_2;
  unsigned_long *args_local_1;
  Identifier *args_local;
  char *text_local;
  ErrorType type_local;
  
  message.field_2._8_8_ = args_2;
  tinyformat::format<Identifier,unsigned_long,unsigned_long>
            ((string *)local_50,(tinyformat *)text,(char *)args,(Identifier *)args_1,args_2,in_R9);
  type_00 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
  text_00._M_str = (char *)args_1;
  text_00._M_len = extraout_RDX;
  queueError((Logger *)(ulong)type,type_00,text_00);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}